

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_uncheckedSlotAtPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t slotIndex;
  
  if (argumentCount != 3) {
    context = (sysbvm_context_t *)0x3;
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  slotIndex = arguments[1] >> 4;
  if ((arguments[1] & 0xf) == 0) {
    slotIndex = 0;
  }
  sysbvm_tuple_uncheckedSlotAtPut(context,*arguments,slotIndex,arguments[2]);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_uncheckedSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_tuple_uncheckedSlotAtPut(context, arguments[0], sysbvm_tuple_anySize_decode(arguments[1]), arguments[2]);
    return SYSBVM_VOID_TUPLE;
}